

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

int __thiscall Server::open(Server *this,char *__file,int __oflag,...)

{
  int extraout_EAX;
  mapped_type *this_00;
  SourceFile file;
  ServerFile entry;
  undefined1 auStack_d8 [64];
  undefined1 local_98 [96];
  string local_38 [32];
  
  std::__cxx11::string::string((string *)auStack_d8,(string *)__file);
  std::__cxx11::string::string((string *)(auStack_d8 + 0x20),___oflag);
  soul::SourceFile::SourceFile((SourceFile *)local_98,(SourceFile *)auStack_d8);
  std::__cxx11::string::string((string *)(local_98 + 0x40),___oflag);
  std::__cxx11::string::string(local_38,(string *)__file);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ServerFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ServerFile>_>_>
            ::operator[](&fileMap_abi_cxx11_,(key_type *)__file);
  ServerFile::operator=(this_00,(ServerFile *)local_98);
  ServerFile::~ServerFile((ServerFile *)local_98);
  soul::SourceFile::~SourceFile((SourceFile *)auStack_d8);
  return extraout_EAX;
}

Assistant:

void Server::open(std::string uri, std::string text)
{
    auto file = soul::SourceFile{uri, text};
    auto entry = ServerFile{
        file,
        text,
        uri};
    fileMap[uri] = entry;
}